

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

void __thiscall
google::protobuf::util::SimpleFieldComparator::SetFractionAndMargin
          (SimpleFieldComparator *this,FieldDescriptor *field,double fraction,double margin)

{
  int iVar1;
  char *pcVar2;
  string_view str;
  string_view v;
  FieldDescriptor *local_58;
  double local_50;
  double local_48;
  LogMessage local_40;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>::iterator,_bool>
  local_30;
  
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
  local_58 = field;
  local_50 = fraction;
  local_48 = margin;
  if (iVar1 - 7U < 0xfffffffe) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator.cc"
               ,0xa3,
               "FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() || FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type()"
              );
    str._M_str = "Field has to be float or double type. Field name is: ";
    str._M_len = 0x35;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    pcVar2 = (local_58->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,v);
    if (iVar1 - 7U < 0xfffffffe) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
  ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
            (&local_30,&this->map_tolerance_,&local_58);
  *(double *)((long)local_30.first.field_1.slot_ + 8) = local_50;
  *(double *)((long)local_30.first.field_1.slot_ + 0x10) = local_48;
  return;
}

Assistant:

void SimpleFieldComparator::SetFractionAndMargin(const FieldDescriptor* field,
                                                 double fraction,
                                                 double margin) {
  ABSL_CHECK(FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() ||
             FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type())
      << "Field has to be float or double type. Field name is: "
      << field->full_name();
  map_tolerance_[field] = Tolerance(fraction, margin);
}